

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O2

void QTlsBackend::setupClientPskAuth
               (QSslPreSharedKeyAuthenticator *auth,char *hint,int hintLength,uint maxIdentityLen,
               uint maxPskLen)

{
  qsizetype qVar1;
  Data *pDVar2;
  char *pcVar3;
  QSslPreSharedKeyAuthenticatorPrivate *pQVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (hint != (char *)0x0) {
    QByteArray::fromRawData((QByteArray *)&local_48,hint,(long)hintLength);
    pQVar4 = QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate>::operator->(&auth->d);
    pDVar2 = (pQVar4->identityHint).d.d;
    pcVar3 = (pQVar4->identityHint).d.ptr;
    (pQVar4->identityHint).d.d = local_48.d;
    (pQVar4->identityHint).d.ptr = local_48.ptr;
    qVar1 = (pQVar4->identityHint).d.size;
    (pQVar4->identityHint).d.size = local_48.size;
    local_48.d = pDVar2;
    local_48.ptr = pcVar3;
    local_48.size = qVar1;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  }
  pQVar4 = QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate>::operator->(&auth->d);
  pQVar4->maximumIdentityLength = maxIdentityLen - 1;
  pQVar4 = QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate>::operator->(&auth->d);
  pQVar4->maximumPreSharedKeyLength = maxPskLen;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTlsBackend::setupClientPskAuth(QSslPreSharedKeyAuthenticator *auth, const char *hint,
                                     int hintLength, unsigned maxIdentityLen, unsigned maxPskLen)
{
    Q_ASSERT(auth);
#if QT_CONFIG(ssl)
    if (hint)
        auth->d->identityHint = QByteArray::fromRawData(hint, hintLength); // it's NUL terminated, but do not include the NUL

    auth->d->maximumIdentityLength = int(maxIdentityLen) - 1; // needs to be NUL terminated
    auth->d->maximumPreSharedKeyLength = int(maxPskLen);
#else
    Q_UNUSED(auth);
    Q_UNUSED(hint);
    Q_UNUSED(hintLength);
    Q_UNUSED(maxIdentityLen);
    Q_UNUSED(maxPskLen);
#endif
}